

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_binder.cpp
# Opt level: O3

void __thiscall
duckdb::RelationBinder::RelationBinder
          (RelationBinder *this,Binder *binder,ClientContext *context,string *op)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  ExpressionBinder::ExpressionBinder(&this->super_ExpressionBinder,binder,context,false);
  (this->super_ExpressionBinder)._vptr_ExpressionBinder =
       (_func_int **)&PTR__RelationBinder_0197d990;
  paVar1 = &(this->op).field_2;
  (this->op)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (op->_M_dataplus)._M_p;
  paVar2 = &op->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&op->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->op).field_2 + 8) = uVar4;
  }
  else {
    (this->op)._M_dataplus._M_p = pcVar3;
    (this->op).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->op)._M_string_length = op->_M_string_length;
  (op->_M_dataplus)._M_p = (pointer)paVar2;
  op->_M_string_length = 0;
  (op->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

RelationBinder::RelationBinder(Binder &binder, ClientContext &context, string op)
    : ExpressionBinder(binder, context), op(std::move(op)) {
}